

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::templates_dir(void)

{
  Path *in_RDI;
  allocator local_51;
  string local_50 [32];
  Path local_30;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"TEMPLATES",&local_51);
  get_xdg_userdir_setting(&local_30,(string *)local_50);
  Path(in_RDI,&local_30.m_path);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return in_RDI;
}

Assistant:

Path Path::templates_dir()
{
#if defined(_PATHIE_UNIX)
  return Path(get_xdg_userdir_setting("TEMPLATES"));
#elif defined(_WIN32)
  wchar_t dir[MAX_PATH];
  HRESULT result = SHGetFolderPathW(NULL, CSIDL_TEMPLATES, NULL, SHGFP_TYPE_CURRENT, dir);
  if (result != S_OK)
    throw(Pathie::WindowsHresultError(result));

  return Path(utf16_to_utf8(dir));
#else
#error Unsupported system.
#endif
}